

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::TCPSocket::~TCPSocket(TCPSocket *this)

{
  long lVar1;
  undefined1 local_30 [8];
  shared_ptr<hwnet::util::Timer> sp;
  
  (this->super_Task)._vptr_Task = (_func_int **)&PTR_Do_0012a940;
  (this->super_Channel)._vptr_Channel = (_func_int **)&DAT_0012a978;
  std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_30,&this->timer);
  if (local_30 != (undefined1  [8])0x0) {
    util::Timer::cancel((Timer *)local_30);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sp);
  close(this->fd);
  std::_Function_base::~_Function_base(&(this->sendTimeoutCallback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->recvTimeoutCallback_).super__Function_base);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->closures).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  any::_destroy(&this->ud);
  std::_Function_base::~_Function_base(&(this->recvCallback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->highWaterCallback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->closeCallback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->errorCallback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->flushCallback_).super__Function_base);
  lVar1 = 0;
  do {
    linklist::~linklist((linklist *)((long)&this->sendLists[1].head + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -0x20);
  std::__cxx11::
  _List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>::
  _M_clear(&(this->recvList).
            super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
          );
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<hwnet::TCPSocket>)._M_weak_this.
              super___weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TCPSocket::~TCPSocket() {
	if(auto sp = this->timer.lock()) {
		sp->cancel();
	}
	::close(this->fd);

#ifdef USE_SSL
	if(this->ssl) {
		SSL_free(this->ssl);
	}
#endif

}